

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupPoint(CEditor *this,void *pContext,CUIRect View)

{
  int v_3;
  int iVar1;
  CQuad *pCVar2;
  int v;
  uint uVar3;
  long lVar4;
  int v_2;
  long lVar5;
  int *piVar6;
  long in_FS_OFFSET;
  int NewVal;
  CProperty aProps [6];
  uint local_bc;
  CUIRect local_b8;
  CProperty local_a8;
  char *local_90;
  int local_88;
  undefined8 local_84;
  undefined4 local_7c;
  char *local_78;
  uint local_70;
  undefined8 local_6c;
  int local_64;
  char *local_60;
  int local_58;
  undefined8 local_54;
  undefined4 local_4c;
  char *local_48;
  int local_40;
  undefined8 local_3c;
  undefined4 local_34;
  undefined1 local_30 [16];
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = View;
  pCVar2 = GetSelectedQuad(this);
  local_58 = 0;
  local_40 = 0;
  lVar4 = 0;
  lVar5 = 0x1a;
  local_70 = 0;
  local_88 = 0;
  local_a8.m_Value = 0;
  do {
    if (((uint)this->m_SelectedPoints >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      local_70 = *(int *)((long)pCVar2->m_aPoints + lVar5 * 2 + -4) << 8 |
                 *(int *)((long)(pCVar2->m_aPoints + -1) + lVar5 * 2) << 0x10 |
                 *(int *)((long)pCVar2->m_aPoints + lVar5 * 2 + -0xc) << 0x18 |
                 *(uint *)((long)&pCVar2->m_aPoints[0].x + lVar5 * 2);
      local_a8.m_Value = pCVar2->m_aPoints[lVar4].x >> 10;
      local_88 = pCVar2->m_aPoints[lVar4].y >> 10;
      local_58 = (int)((float)pCVar2->m_aTexcoords[lVar4].x * 0.0009765625 * 1024.0);
      local_40 = (int)((float)pCVar2->m_aTexcoords[lVar4].y * 0.0009765625 * 1024.0);
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 8;
  } while (lVar4 != 4);
  local_a8.m_pName = "Pos X";
  local_a8.m_Type = 3;
  local_a8.m_Min = -1000000;
  local_a8.m_Max = 1000000;
  local_90 = "Pos Y";
  local_84 = 0xfff0bdc000000003;
  local_7c = 1000000;
  local_78 = "Color";
  local_6c = 0xffffffff00000004;
  local_64 = (this->m_Map).m_lEnvelopes.num_elements;
  local_60 = "Tex U";
  local_54 = 0xfff0bdc000000003;
  local_4c = 1000000;
  local_48 = "Tex V";
  local_3c = 0xfff0bdc000000003;
  local_34 = 1000000;
  local_30 = (undefined1  [16])0x0;
  local_20 = 0;
  local_bc = 0;
  iVar1 = DoProperties(this,&local_b8,&local_a8,PopupPoint::s_aIds,(int *)&local_bc);
  if (iVar1 == -1) goto switchD_001a9764_default;
  (this->m_Map).m_Modified = true;
  switch(iVar1) {
  case 0:
    uVar3 = this->m_SelectedPoints;
    lVar4 = 0;
    do {
      if ((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        pCVar2->m_aPoints[lVar4].x = local_bc << 10;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    goto switchD_001a9764_default;
  case 1:
    uVar3 = this->m_SelectedPoints;
    lVar4 = 0;
    do {
      if ((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        pCVar2->m_aPoints[lVar4].y = local_bc << 10;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (iVar1 != 4) {
      if (iVar1 != 3) {
        if (iVar1 != 2) goto switchD_001a9764_default;
        goto LAB_001a97a0;
      }
      goto LAB_001a980c;
    }
    break;
  case 2:
    uVar3 = this->m_SelectedPoints;
LAB_001a97a0:
    piVar6 = &pCVar2->m_aColors[0].a;
    lVar4 = 0;
    do {
      if ((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        ((CColor *)(piVar6 + -3))->r = local_bc >> 0x18;
        piVar6[-2] = local_bc >> 0x10 & 0xff;
        piVar6[-1] = local_bc >> 8 & 0xff;
        *piVar6 = local_bc & 0xff;
      }
      lVar4 = lVar4 + 1;
      piVar6 = piVar6 + 4;
    } while (lVar4 != 4);
    if (iVar1 != 4) {
      if (iVar1 != 3) goto switchD_001a9764_default;
      goto LAB_001a980c;
    }
    break;
  case 3:
    uVar3 = this->m_SelectedPoints;
LAB_001a980c:
    lVar4 = 0;
    do {
      if ((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        pCVar2->m_aTexcoords[lVar4].x = (int)((float)(int)local_bc * 0.0009765625 * 1024.0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (iVar1 != 4) goto switchD_001a9764_default;
    break;
  case 4:
    uVar3 = this->m_SelectedPoints;
    break;
  default:
    goto switchD_001a9764_default;
  }
  lVar4 = 0;
  do {
    if ((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      pCVar2->m_aTexcoords[lVar4].y = (int)((float)(int)local_bc * 0.0009765625 * 1024.0);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
switchD_001a9764_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupPoint(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CQuad *pQuad = pEditor->GetSelectedQuad();

	enum
	{
		PROP_POS_X=0,
		PROP_POS_Y,
		PROP_COLOR,
		PROP_TEX_U,
		PROP_TEX_V,
		NUM_PROPS,
	};

	int Color = 0;
	int x = 0, y = 0;
	int tu = 0, tv = 0;

	for(int v = 0; v < 4; v++)
	{
		if(pEditor->m_SelectedPoints&(1<<v))
		{
			Color = 0;
			Color |= pQuad->m_aColors[v].r<<24;
			Color |= pQuad->m_aColors[v].g<<16;
			Color |= pQuad->m_aColors[v].b<<8;
			Color |= pQuad->m_aColors[v].a;

			x = fx2i(pQuad->m_aPoints[v].x);
			y = fx2i(pQuad->m_aPoints[v].y);
			tu = fx2f(pQuad->m_aTexcoords[v].x)*1024;
			tv = fx2f(pQuad->m_aTexcoords[v].y)*1024;
		}
	}


	CProperty aProps[] = {
		{"Pos X", x, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Pos Y", y, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Color", Color, PROPTYPE_COLOR, -1, pEditor->m_Map.m_lEnvelopes.size()},
		{"Tex U", tu, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Tex V", tv, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{0},
	};

	static int s_aIds[NUM_PROPS] = {0};
	int NewVal = 0;
	int Prop = pEditor->DoProperties(&View, aProps, s_aIds, &NewVal);
	if(Prop != -1)
		pEditor->m_Map.m_Modified = true;

	if(Prop == PROP_POS_X)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aPoints[v].x = i2fx(NewVal);
	}
	if(Prop == PROP_POS_Y)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aPoints[v].y = i2fx(NewVal);
	}
	if(Prop == PROP_COLOR)
	{
		for(int v = 0; v < 4; v++)
		{
			if(pEditor->m_SelectedPoints&(1<<v))
			{
				pQuad->m_aColors[v].r = (NewVal>>24)&0xff;
				pQuad->m_aColors[v].g = (NewVal>>16)&0xff;
				pQuad->m_aColors[v].b = (NewVal>>8)&0xff;
				pQuad->m_aColors[v].a = NewVal&0xff;
			}
		}
	}
	if(Prop == PROP_TEX_U)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aTexcoords[v].x = f2fx(NewVal/1024.0f);
	}
	if(Prop == PROP_TEX_V)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aTexcoords[v].y = f2fx(NewVal/1024.0f);
	}

	return false;
}